

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::ini_join
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,char sepChar,char arrayStart,char arrayEnd,char stringQuote,
                   char literalQuote)

{
  bool bVar1;
  size_type sVar2;
  char in_CL;
  long lVar3;
  char in_DL;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  char cVar4;
  string *in_RDI;
  char in_R8B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  size_t start;
  bool disable_multi_line;
  string *joined;
  bool in_stack_000001c5;
  char in_stack_000001c6;
  char in_stack_000001c7;
  string *in_stack_000001c8;
  uint in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  locale *in_stack_ffffffffffffff60;
  string local_78 [32];
  locale local_58 [8];
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  long local_30;
  undefined1 local_16;
  undefined1 local_15;
  char local_13;
  char local_12;
  char local_11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_15 = 0;
  local_16 = 0;
  local_13 = in_R8B;
  local_12 = in_CL;
  local_11 = in_DL;
  local_10 = in_RSI;
  ::std::__cxx11::string::string((string *)in_RDI);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_10);
  cVar4 = (char)in_RDI;
  if ((1 < sVar2) && (local_12 != '\0')) {
    ::std::__cxx11::string::push_back(cVar4);
    local_15 = 1;
  }
  local_30 = 0;
  local_38 = local_10;
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff60,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)), bVar1
        ) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_40);
    lVar3 = local_30 + 1;
    bVar1 = local_30 != 0;
    local_30 = lVar3;
    if (bVar1) {
      ::std::__cxx11::string::push_back(cVar4);
      in_stack_ffffffffffffff5c = (int)local_11;
      in_stack_ffffffffffffff60 = local_58;
      ::std::locale::locale(in_stack_ffffffffffffff60);
      bVar1 = std::isspace<char>((char)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                                 (locale *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      in_stack_ffffffffffffff58 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff58) ^ 0xff000000;
      ::std::locale::~locale(local_58);
      if ((in_stack_ffffffffffffff58 & 0x1000000) != 0) {
        ::std::__cxx11::string::push_back(cVar4);
      }
    }
    convert_arg_for_ini(in_stack_000001c8,in_stack_000001c7,in_stack_000001c6,in_stack_000001c5);
    ::std::__cxx11::string::append((string *)in_RDI);
    ::std::__cxx11::string::~string(local_78);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_40);
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_10);
  if ((1 < sVar2) && (local_13 != '\0')) {
    ::std::__cxx11::string::push_back(cVar4);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string ini_join(const std::vector<std::string> &args,
                                  char sepChar,
                                  char arrayStart,
                                  char arrayEnd,
                                  char stringQuote,
                                  char literalQuote) {
    bool disable_multi_line{false};
    std::string joined;
    if(args.size() > 1 && arrayStart != '\0') {
        joined.push_back(arrayStart);
        disable_multi_line = true;
    }
    std::size_t start = 0;
    for(const auto &arg : args) {
        if(start++ > 0) {
            joined.push_back(sepChar);
            if(!std::isspace<char>(sepChar, std::locale())) {
                joined.push_back(' ');
            }
        }
        joined.append(convert_arg_for_ini(arg, stringQuote, literalQuote, disable_multi_line));
    }
    if(args.size() > 1 && arrayEnd != '\0') {
        joined.push_back(arrayEnd);
    }
    return joined;
}